

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__resample_horizontal_downsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  stbir__contributors *psVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  float coefficient_4;
  int out_pixel_index_4;
  int c;
  int coefficient_group_4;
  int max_n_4;
  int in_pixel_index_4;
  int in_x_4;
  int n1_4;
  int n0_4;
  float coefficient_3;
  int out_pixel_index_3;
  int coefficient_group_3;
  int max_n_3;
  int in_pixel_index_3;
  int in_x_3;
  int n1_3;
  int n0_3;
  float coefficient_2;
  int out_pixel_index_2;
  int coefficient_group_2;
  int max_n_2;
  int in_pixel_index_2;
  int in_x_2;
  int n1_2;
  int n0_2;
  float coefficient_1;
  int out_pixel_index_1;
  int coefficient_group_1;
  int max_n_1;
  int in_pixel_index_1;
  int in_x_1;
  int n1_1;
  int n0_1;
  float coefficient;
  int out_pixel_index;
  int coefficient_group;
  int max_n;
  int in_pixel_index;
  int in_x;
  int n1;
  int n0;
  int max_x;
  int filter_pixel_margin;
  int coefficient_width;
  float *horizontal_coefficients;
  stbir__contributors *horizontal_contributors;
  float *decode_buffer;
  int channels;
  int input_w;
  int k;
  int x;
  float *output_buffer_local;
  stbir__info *stbir_info_local;
  
  iVar7 = stbir_info->input_w;
  iVar2 = stbir_info->channels;
  pfVar10 = stbir__get_decode_buffer(stbir_info);
  psVar5 = stbir_info->horizontal_contributors;
  pfVar6 = stbir_info->horizontal_coefficients;
  iVar3 = stbir_info->horizontal_coefficient_width;
  iVar4 = stbir_info->horizontal_filter_pixel_margin;
  iVar7 = iVar7 + iVar4 * 2;
  iVar8 = stbir__use_width_upsampling(stbir_info);
  if (iVar8 != 0) {
    __assert_fail("!stbir__use_width_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x601,"void stbir__resample_horizontal_downsample(stbir__info *, float *)");
  }
  switch(iVar2) {
  case 1:
    for (input_w = 0; input_w < iVar7; input_w = input_w + 1) {
      iVar8 = psVar5[input_w].n1;
      iVar2 = psVar5[input_w].n0;
      for (channels = iVar2; channels <= iVar8; channels = channels + 1) {
        fVar1 = pfVar6[(iVar3 * input_w + channels) - iVar2];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x613,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[channels] = pfVar10[input_w - iVar4] * fVar1 + output_buffer[channels];
      }
    }
    break;
  case 2:
    for (input_w = 0; input_w < iVar7; input_w = input_w + 1) {
      iVar8 = psVar5[input_w].n1;
      iVar9 = (input_w - iVar4) * 2;
      iVar2 = psVar5[input_w].n0;
      for (channels = iVar2; channels <= iVar8; channels = channels + 1) {
        iVar11 = channels * 2;
        fVar1 = pfVar6[(iVar3 * input_w + channels) - iVar2];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x628,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[iVar11] = pfVar10[iVar9] * fVar1 + output_buffer[iVar11];
        output_buffer[iVar11 + 1] = pfVar10[iVar9 + 1] * fVar1 + output_buffer[iVar11 + 1];
      }
    }
    break;
  case 3:
    for (input_w = 0; input_w < iVar7; input_w = input_w + 1) {
      iVar8 = psVar5[input_w].n1;
      iVar9 = (input_w - iVar4) * 3;
      iVar2 = psVar5[input_w].n0;
      for (channels = iVar2; channels <= iVar8; channels = channels + 1) {
        iVar11 = channels * 3;
        fVar1 = pfVar6[(iVar3 * input_w + channels) - iVar2];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x63e,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[iVar11] = pfVar10[iVar9] * fVar1 + output_buffer[iVar11];
        output_buffer[iVar11 + 1] = pfVar10[iVar9 + 1] * fVar1 + output_buffer[iVar11 + 1];
        output_buffer[iVar11 + 2] = pfVar10[iVar9 + 2] * fVar1 + output_buffer[iVar11 + 2];
      }
    }
    break;
  case 4:
    for (input_w = 0; input_w < iVar7; input_w = input_w + 1) {
      iVar8 = psVar5[input_w].n1;
      iVar9 = (input_w - iVar4) * 4;
      iVar2 = psVar5[input_w].n0;
      for (channels = iVar2; channels <= iVar8; channels = channels + 1) {
        iVar11 = channels * 4;
        fVar1 = pfVar6[(iVar3 * input_w + channels) - iVar2];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x655,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        output_buffer[iVar11] = pfVar10[iVar9] * fVar1 + output_buffer[iVar11];
        output_buffer[iVar11 + 1] = pfVar10[iVar9 + 1] * fVar1 + output_buffer[iVar11 + 1];
        output_buffer[iVar11 + 2] = pfVar10[iVar9 + 2] * fVar1 + output_buffer[iVar11 + 2];
        output_buffer[iVar11 + 3] = pfVar10[iVar9 + 3] * fVar1 + output_buffer[iVar11 + 3];
      }
    }
    break;
  default:
    for (input_w = 0; input_w < iVar7; input_w = input_w + 1) {
      iVar9 = psVar5[input_w].n1;
      iVar8 = psVar5[input_w].n0;
      for (channels = iVar8; channels <= iVar9; channels = channels + 1) {
        fVar1 = pfVar6[(iVar3 * input_w + channels) - iVar8];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                        ,0x66e,"void stbir__resample_horizontal_downsample(stbir__info *, float *)")
          ;
        }
        for (coefficient_4 = 0.0; (int)coefficient_4 < iVar2;
            coefficient_4 = (float)((int)coefficient_4 + 1)) {
          iVar11 = channels * iVar2 + (int)coefficient_4;
          output_buffer[iVar11] =
               pfVar10[(input_w - iVar4) * iVar2 + (int)coefficient_4] * fVar1 +
               output_buffer[iVar11];
        }
      }
    }
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_downsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int input_w = stbir_info->input_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;
    int filter_pixel_margin = stbir_info->horizontal_filter_pixel_margin;
    int max_x = input_w + filter_pixel_margin * 2;

    STBIR_ASSERT(!stbir__use_width_upsampling(stbir_info));

    switch (channels) {
        case 1:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 1;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
            }
            break;

        case 2:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 2;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
            }
            break;

        case 3:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 3;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
            }
            break;

        case 4:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * 4;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int out_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
            }
            break;

        default:
            for (x = 0; x < max_x; x++)
            {
                int n0 = horizontal_contributors[x].n0;
                int n1 = horizontal_contributors[x].n1;

                int in_x = x - filter_pixel_margin;
                int in_pixel_index = in_x * channels;
                int max_n = n1;
                int coefficient_group = coefficient_width * x;

                for (k = n0; k <= max_n; k++)
                {
                    int c;
                    int out_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + k - n0];
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
            }
            break;
    }
}